

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O0

void __thiscall nodecpp::log::LogTransport::~LogTransport(LogTransport *this)

{
  size_t sVar1;
  size_t refCtr;
  LogTransport *this_local;
  
  if (((this->logData != (LogBufferBaseData *)0x0) &&
      (sVar1 = LogBufferBaseData::removeRef(this->logData), sVar1 == 0)) &&
     (this->logData != (LogBufferBaseData *)0x0)) {
    LogBufferBaseData::deinit(this->logData);
  }
  ChainedWaitingForGuaranteedWrite::~ChainedWaitingForGuaranteedWrite(&this->gww);
  return;
}

Assistant:

~LogTransport()
		{
			if ( logData != nullptr )
			{
				size_t refCtr = logData->removeRef();
				if ( refCtr == 0 && logData != nullptr ) 
				{
					logData->deinit();
				}
			}
		}